

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O3

void __thiscall
QDataWidgetMapper::setItemDelegate(QDataWidgetMapper *this,QAbstractItemDelegate *delegate)

{
  QDataWidgetMapperPrivate *this_00;
  QAbstractItemDelegate *oldDelegate;
  void **ppvVar1;
  void *pvVar2;
  undefined4 *puVar3;
  unsigned_long __i0;
  long lVar4;
  long in_FS_OFFSET;
  code *local_68;
  ImplFn local_60;
  code *local_58;
  undefined8 local_50;
  Connection local_48;
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDataWidgetMapperPrivate **)(this + 8);
  oldDelegate = this_00->delegate;
  lVar4 = 200;
  do {
    QObject::disconnect((Connection *)(&this_00->super_QObjectPrivate + lVar4));
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0xd8);
  this_00->delegate = delegate;
  if (delegate == (QAbstractItemDelegate *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QDataWidgetMapperPrivate::flipEventFilters(this_00,oldDelegate,(QAbstractItemDelegate *)0x0);
      return;
    }
  }
  else {
    local_58 = QAbstractItemDelegate::commitData;
    lVar4 = 0;
    local_50 = 0;
    local_68 = QDataWidgetMapperPrivate::commitData;
    local_60 = (ImplFn)0x0;
    ppvVar1 = *(void ***)&this_00->field_0x8;
    puVar3 = (undefined4 *)operator_new(0x20);
    *puVar3 = 1;
    *(code **)(puVar3 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QDataWidgetMapperPrivate::*)(QWidget_*),_QtPrivate::List<QWidget_*>,_void>
         ::impl;
    *(code **)(puVar3 + 4) = QDataWidgetMapperPrivate::commitData;
    *(undefined8 *)(puVar3 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_48,(void **)delegate,(QObject *)&local_58,ppvVar1,
               (QSlotObjectBase *)&local_68,(ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
    local_58 = QAbstractItemDelegate::closeEditor;
    local_50 = 0;
    local_68 = QDataWidgetMapperPrivate::closeEditor;
    local_60 = (ImplFn)0x0;
    ppvVar1 = *(void ***)&this_00->field_0x8;
    puVar3 = (undefined4 *)operator_new(0x20);
    *puVar3 = 1;
    *(code **)(puVar3 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QDataWidgetMapperPrivate::*)(QWidget_*,_QAbstractItemDelegate::EndEditHint),_QtPrivate::List<QWidget_*,_QAbstractItemDelegate::EndEditHint>,_void>
         ::impl;
    *(code **)(puVar3 + 4) = QDataWidgetMapperPrivate::closeEditor;
    *(undefined8 *)(puVar3 + 6) = 0;
    QObject::connectImpl
              (local_40,(void **)delegate,(QObject *)&local_58,ppvVar1,(QSlotObjectBase *)&local_68,
               (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
    do {
      pvVar2 = (this_00->delegateConnections)._M_elems[lVar4].d_ptr;
      (this_00->delegateConnections)._M_elems[lVar4].d_ptr = (&local_48)[lVar4].d_ptr;
      (&local_48)[lVar4].d_ptr = pvVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
    lVar4 = 8;
    do {
      QMetaObject::Connection::~Connection((Connection *)((long)&local_48.d_ptr + lVar4));
      lVar4 = lVar4 + -8;
    } while (lVar4 != -8);
    QDataWidgetMapperPrivate::flipEventFilters(this_00,oldDelegate,delegate);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QDataWidgetMapper::setItemDelegate(QAbstractItemDelegate *delegate)
{
    Q_D(QDataWidgetMapper);
    QAbstractItemDelegate *oldDelegate = d->delegate;
    d->disconnectDelegate();

    d->delegate = delegate;

    if (delegate) {
        d->delegateConnections = {
            QObjectPrivate::connect(delegate, &QAbstractItemDelegate::commitData,
                                    d, &QDataWidgetMapperPrivate::commitData),
            QObjectPrivate::connect(delegate, &QAbstractItemDelegate::closeEditor,
                                    d, &QDataWidgetMapperPrivate::closeEditor)
        };
    }

    d->flipEventFilters(oldDelegate, delegate);
}